

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::FenceVkImpl::Wait(FenceVkImpl *this,Uint64 Value)

{
  bool bVar1;
  element_type *this_00;
  Char *pCVar2;
  undefined1 local_c8 [8];
  string msg_1;
  VkFence pVStack_a0;
  VkResult status;
  VkFence Fence;
  SyncPointData *Item;
  VulkanLogicalDevice *LogicalDevice_1;
  lock_guard<std::mutex> Lock;
  undefined1 local_70 [8];
  string msg;
  undefined1 local_48 [4];
  VkResult err;
  VkSemaphoreWaitInfo WaitInfo;
  VulkanLogicalDevice *LogicalDevice;
  Uint64 Value_local;
  FenceVkImpl *this_local;
  
  LogicalDevice = (VulkanLogicalDevice *)Value;
  Value_local = (Uint64)this;
  bVar1 = IsTimelineSemaphore(this);
  if (bVar1) {
    WaitInfo.pValues =
         (uint64_t *)
         RenderDeviceVkImpl::GetLogicalDevice
                   ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                    .m_pDevice);
    memset(local_48,0,0x28);
    local_48 = (undefined1  [4])0x3b9df29c;
    WaitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    WaitInfo._4_4_ = 0;
    WaitInfo.pNext._0_4_ = 0;
    WaitInfo.pNext._4_4_ = 1;
    WaitInfo._16_8_ =
         VulkanUtilities::
         VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::operator&
                   (&this->m_TimelineSemaphore);
    WaitInfo.pSemaphores = (VkSemaphore *)&LogicalDevice;
    msg.field_2._12_4_ =
         VulkanUtilities::VulkanLogicalDevice::WaitSemaphores
                   ((VulkanLogicalDevice *)WaitInfo.pValues,(VkSemaphoreWaitInfo *)local_48,
                    0xffffffffffffffff);
    if (msg.field_2._12_4_ != VK_SUCCESS) {
      FormatString<char[34]>((string *)local_70,(char (*) [34])"Failed to wait timeline semaphore");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"Wait",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xd0);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&LogicalDevice_1,&this->m_SyncPointsGuard);
    Item = (SyncPointData *)
           RenderDeviceVkImpl::GetLogicalDevice
                     ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                      .m_pDevice);
    while ((bVar1 = std::
                    deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                    ::empty(&this->m_SyncPoints), ((bVar1 ^ 0xffU) & 1) != 0 &&
           (Fence = (VkFence)std::
                             deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                             ::front(&this->m_SyncPoints),
           (VulkanLogicalDevice *)((reference)Fence)->Value <= LogicalDevice))) {
      this_00 = std::
                __shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&((reference)Fence)->SyncPoint);
      pVStack_a0 = SyncPointVk::GetFence(this_00);
      msg_1.field_2._12_4_ =
           VulkanUtilities::VulkanLogicalDevice::GetFenceStatus
                     ((VulkanLogicalDevice *)Item,pVStack_a0);
      if (msg_1.field_2._12_4_ == VK_NOT_READY) {
        msg_1.field_2._12_4_ =
             VulkanUtilities::VulkanLogicalDevice::WaitForFences
                       ((VulkanLogicalDevice *)Item,1,&stack0xffffffffffffff60,1,0xffffffffffffffff)
        ;
      }
      if (msg_1.field_2._12_4_ != 0) {
        FormatString<char[41]>
                  ((string *)local_c8,(char (*) [41])"All pending fences must now be complete!");
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"Wait",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                   ,0xe4);
        std::__cxx11::string::~string((string *)local_c8);
      }
      FenceBase<Diligent::EngineVkImplTraits>::UpdateLastCompletedFenceValue
                (&this->super_FenceBase<Diligent::EngineVkImplTraits>,*(Uint64 *)Fence);
      std::
      deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ::pop_front(&this->m_SyncPoints);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&LogicalDevice_1);
  }
  return;
}

Assistant:

void FenceVkImpl::Wait(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        VkSemaphoreWaitInfo WaitInfo{};
        WaitInfo.sType          = VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO;
        WaitInfo.pNext          = nullptr;
        WaitInfo.flags          = 0;
        WaitInfo.semaphoreCount = 1;
        WaitInfo.pSemaphores    = &m_TimelineSemaphore;
        WaitInfo.pValues        = &Value;

        VkResult err = LogicalDevice.WaitSemaphores(WaitInfo, UINT64_MAX);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to wait timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
        while (!m_SyncPoints.empty())
        {
            SyncPointData& Item = m_SyncPoints.front();
            if (Item.Value > Value)
                break;

            VkFence  Fence  = Item.SyncPoint->GetFence();
            VkResult status = LogicalDevice.GetFenceStatus(Fence);
            if (status == VK_NOT_READY)
            {
                status = LogicalDevice.WaitForFences(1, &Fence, VK_TRUE, UINT64_MAX);
            }

            DEV_CHECK_ERR(status == VK_SUCCESS, "All pending fences must now be complete!");
            UpdateLastCompletedFenceValue(Item.Value);

            m_SyncPoints.pop_front();
        }
    }
}